

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_opt.c
# Opt level: O1

MPP_RET mpp_opt_parse(MppOpt opt,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  MPP_RET MVar6;
  long lVar7;
  MPP_RET MVar8;
  char *pcVar9;
  
  MVar8 = MPP_NOK;
  if ((((opt != (MppOpt)0x0) && (argv != (char **)0x0)) && (1 < argc)) &&
     (*(long *)((long)opt + 8) != 0)) {
    iVar5 = 0;
    MVar8 = MPP_OK;
    do {
      if (argc < iVar5) {
        return MVar8;
      }
      iVar1 = iVar5 + 1;
      if (iVar1 < argc) {
        pcVar9 = argv[iVar1];
      }
      else {
        pcVar9 = (char *)0x0;
      }
      pcVar2 = argv[iVar5];
      bVar4 = true;
      iVar5 = iVar1;
      MVar6 = MVar8;
      if (pcVar2 != (char *)0x0) {
        if ((*pcVar2 == '-') && (pcVar2[1] != '\0')) {
          lVar7 = mpp_trie_get_info(*(undefined8 *)((long)opt + 8),pcVar2 + 1);
          if (lVar7 == 0) {
            bVar4 = false;
            _mpp_log_l(2,"mpp_opt","invalid option %s\n",0,pcVar2 + 1);
          }
          else {
            pcVar3 = *(code **)(lVar7 + 0x1c + (ulong)*(byte *)(lVar7 + 3));
            if (pcVar3 == (code *)0x0) {
              MVar6 = MPP_OK;
            }
            else {
              MVar6 = (*pcVar3)(*opt,pcVar9);
            }
            if (MPP_NOK < MVar6) {
              bVar4 = false;
              iVar5 = iVar1 + MVar6;
              MVar6 = MVar8;
            }
          }
        }
        else {
          bVar4 = false;
        }
      }
      MVar8 = MVar6;
    } while (!bVar4);
  }
  return MVar8;
}

Assistant:

MPP_RET mpp_opt_parse(MppOpt opt, int argc, char **argv)
{
    MppOptImpl *impl = (MppOptImpl *)opt;
    MPP_RET ret = MPP_NOK;
    RK_S32 opt_idx = 0;

    if (NULL == impl || NULL == impl->trie || argc < 2 || NULL == argv)
        return ret;

    ret = MPP_OK;

    while (opt_idx <= argc) {
        RK_S32 opt_next = opt_idx + 1;
        char *opts = argv[opt_idx++];
        char *next = (opt_next >= argc) ? NULL : argv[opt_next];

        if (NULL == opts)
            break;

        if (opts[0] == '-' && opts[1] != '\0') {
            MppOptInfo *info = NULL;
            MppTrieInfo *node = mpp_trie_get_info(impl->trie, opts + 1);
            RK_S32 step = 0;

            if (NULL == node) {
                mpp_err("invalid option %s\n", opts + 1);
                continue;
            }

            info = mpp_trie_info_ctx(node);
            if (info->proc)
                step = info->proc(impl->ctx, next);

            /* option failure or help */
            if (step < 0) {
                ret = step;
                break;
            }

            opt_idx += step;
        }
    }

    return ret;
}